

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::CeilCase::compare(CeilCase *this,void **inputs,void **outputs)

{
  float a;
  Precision PVar1;
  pointer pSVar2;
  uint uVar3;
  uint uVar4;
  deUint32 dVar5;
  uint uVar6;
  ostream *poVar7;
  int roundedVal;
  int iVar8;
  ulong uVar9;
  int iVar10;
  Hex<8UL> hex;
  ulong uVar11;
  int iVar12;
  deUint32 u32;
  float fVar13;
  float fVar14;
  float fVar15;
  deUint32 u32_1;
  HexFloat local_34;
  
  pSVar2 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar2->varType).m_data.basic.precision;
  uVar3 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  if (PVar1 - PRECISION_MEDIUMP < 2) {
    uVar9 = 0;
    uVar11 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar11 = uVar9;
    }
    for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      fVar13 = ceilf(*(float *)((long)*inputs + uVar9 * 4));
      fVar14 = *(float *)((long)*outputs + uVar9 * 4);
      if (PVar1 == PRECISION_HIGHP) {
        uVar4 = (int)fVar13 - (int)fVar14;
        if ((uint)fVar13 < (uint)fVar14) {
          uVar4 = -((int)fVar13 - (int)fVar14);
        }
      }
      else {
        uVar4 = getUlpDiffIgnoreZeroSign(fVar14,fVar13);
      }
      if (uVar4 != 0) {
        poVar7 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                  super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar9);
        poVar7 = std::operator<<(poVar7,"] = ");
        local_34.value = fVar13;
        poVar7 = Functional::operator<<(poVar7,&local_34);
        poVar7 = std::operator<<(poVar7,", got ULP diff ");
LAB_010fd4fb:
        hex.value._4_4_ = 0;
        hex.value._0_4_ = uVar4;
        tcu::Format::operator<<(poVar7,hex);
        return false;
      }
    }
  }
  else {
    uVar4 = ~(-1 << (0x17U - (char)*(int *)(&DAT_01864fb8 + (ulong)PVar1 * 4) & 0x1f));
    fVar14 = getEpsFromBits(1.0,*(int *)(&DAT_01864fb8 + (ulong)PVar1 * 4));
    uVar9 = 0;
    uVar11 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar11 = uVar9;
    }
    for (; uVar9 != uVar11; uVar9 = uVar9 + 1) {
      fVar13 = *(float *)((long)*inputs + uVar9 * 4);
      a = *(float *)((long)*outputs + uVar9 * 4);
      fVar15 = ceilf(fVar13 - fVar14);
      iVar12 = (int)fVar15;
      fVar13 = ceilf(fVar13 + fVar14);
      iVar10 = (int)fVar13;
      iVar8 = iVar12;
      do {
        if (iVar10 < iVar8) {
          if ((iVar12 < 1) && (-1 < iVar10)) {
            uVar6 = (int)a + 0x80000000;
            uVar3 = -uVar6;
            if (0 < (int)uVar6) {
              uVar3 = uVar6;
            }
            if (uVar3 <= uVar4) break;
          }
          poVar7 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                    super_basic_ostream<char,_std::char_traits<char>_>,"Expected [")
          ;
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar9);
          poVar7 = std::operator<<(poVar7,"] = [");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar12);
          poVar7 = std::operator<<(poVar7,", ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar10);
          poVar7 = std::operator<<(poVar7,"] with ULP threshold ");
          goto LAB_010fd4fb;
        }
        dVar5 = getUlpDiffIgnoreZeroSign(a,(float)iVar8);
        iVar8 = iVar8 + 1;
      } while (uVar4 < dVar5);
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasZeroSign		= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref			= deFloatCeil(in0);

				const deUint32	ulpDiff		= hasZeroSign ? getUlpDiff(out0, ref) : getUlpDiffIgnoreZeroSign(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(deFloatCeil(in0-eps));
				const int		maxRes		= int(deFloatCeil(in0+eps));
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiffIgnoreZeroSign(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk && de::inRange(0, minRes, maxRes))
				{
					// Allow -0 as well.
					const int ulpDiff = de::abs((int)tcu::Float32(out0).bits() - (int)0x80000000u);
					anyOk = ((deUint32)ulpDiff <= maxUlpDiff);
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}